

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_completions.cc
# Opt level: O0

void gflags::anon_unknown_2::PrintFlagCompletionInfo(void)

{
  size_t *psVar1;
  pointer *this;
  FILE *pFVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  undefined8 uVar6;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_258;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_250;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_248;
  const_iterator it;
  string local_238 [32];
  undefined1 local_218 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  completions;
  NotableFlags notable_flags;
  string package_dir;
  string local_f0 [8];
  string module;
  string local_c8 [8];
  string longest_common_prefix;
  undefined1 local_a8 [8];
  set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
  matching_flags;
  vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_> all_flags;
  CompletionOptions local_4d;
  string local_48 [3];
  CompletionOptions options;
  string canonical_token;
  string local_28 [8];
  string cursor_word;
  
  std::__cxx11::string::string(local_28,fLS::FLAGS_tab_completion_word_abi_cxx11_);
  std::__cxx11::string::string(local_48);
  CompletionOptions::CompletionOptions(&local_4d);
  CanonicalizeCursorWordAndSearchOptions((string *)local_28,(string *)local_48,&local_4d);
  psVar1 = &matching_flags._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>::vector
            ((vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_> *)
             psVar1);
  std::
  set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
  ::set((set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
         *)local_a8);
  GetAllFlags((vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_> *)
              psVar1);
  std::__cxx11::string::string(local_c8);
  FindMatchingFlags((vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>
                     *)&matching_flags._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_4d,
                    (string *)local_48,
                    (set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
                     *)local_a8,(string *)local_c8);
  uVar4 = std::__cxx11::string::size();
  uVar5 = std::__cxx11::string::size();
  pFVar2 = _stdout;
  if (uVar5 < uVar4) {
    uVar6 = std::__cxx11::string::c_str();
    fprintf(pFVar2,"--%s",uVar6);
  }
  else {
    bVar3 = std::
            set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
            ::empty((set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
                     *)local_a8);
    if (!bVar3) {
      std::__cxx11::string::string(local_f0);
      psVar1 = &notable_flags.subpackage_flags._M_t._M_impl.super__Rb_tree_header._M_node_count;
      std::__cxx11::string::string((string *)psVar1);
      TryFindModuleAndPackageDir
                ((vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>
                  *)&matching_flags._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (string *)local_f0,(string *)psVar1);
      this = &completions.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
      NotableFlags::NotableFlags((NotableFlags *)this);
      CategorizeAllMatchingFlags
                ((set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
                  *)local_a8,(string *)local_48,(string *)local_f0,
                 (string *)
                 &notable_flags.subpackage_flags._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (NotableFlags *)this);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_218);
      FinalizeCompletionOutput
                ((set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
                  *)local_a8,&local_4d,
                 (NotableFlags *)
                 &completions.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_218);
      if ((local_4d.force_no_update & 1U) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_238,"~",(allocator *)((long)&it._M_current + 7));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_218,(value_type *)local_238);
        std::__cxx11::string::~string(local_238);
        std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
      }
      local_250._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_218);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_248,&local_250);
      while( true ) {
        local_258._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_218);
        bVar3 = __gnu_cxx::operator!=(&local_248,&local_258);
        pFVar2 = _stdout;
        if (!bVar3) break;
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator->(&local_248);
        uVar6 = std::__cxx11::string::c_str();
        fprintf(pFVar2,"%s\n",uVar6);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_248);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_218);
      NotableFlags::~NotableFlags
                ((NotableFlags *)
                 &completions.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string
                ((string *)
                 &notable_flags.subpackage_flags._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string(local_f0);
    }
  }
  std::__cxx11::string::~string(local_c8);
  std::
  set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
  ::~set((set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
          *)local_a8);
  std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>::~vector
            ((vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_> *)
             &matching_flags._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

static void PrintFlagCompletionInfo(void) {
  string cursor_word = FLAGS_tab_completion_word;
  string canonical_token;
  CompletionOptions options = CompletionOptions();
  CanonicalizeCursorWordAndSearchOptions(
      cursor_word,
      &canonical_token,
      &options);

  DVLOG(1) << "Identified canonical_token: '" << canonical_token << "'";

  vector<CommandLineFlagInfo> all_flags;
  set<const CommandLineFlagInfo *> matching_flags;
  GetAllFlags(&all_flags);
  DVLOG(2) << "Found " << all_flags.size() << " flags overall";

  string longest_common_prefix;
  FindMatchingFlags(
      all_flags,
      options,
      canonical_token,
      &matching_flags,
      &longest_common_prefix);
  DVLOG(1) << "Identified " << matching_flags.size() << " matching flags";
  DVLOG(1) << "Identified " << longest_common_prefix
          << " as longest common prefix.";
  if (longest_common_prefix.size() > canonical_token.size()) {
    // There's actually a shared common prefix to all matching flags,
    // so may as well output that and quit quickly.
    DVLOG(1) << "The common prefix '" << longest_common_prefix
            << "' was longer than the token '" << canonical_token
            << "'.  Returning just this prefix for completion.";
    fprintf(stdout, "--%s", longest_common_prefix.c_str());
    return;
  }
  if (matching_flags.empty()) {
    VLOG(1) << "There were no matching flags, returning nothing.";
    return;
  }

  string module;
  string package_dir;
  TryFindModuleAndPackageDir(all_flags, &module, &package_dir);
  DVLOG(1) << "Identified module: '" << module << "'";
  DVLOG(1) << "Identified package_dir: '" << package_dir << "'";

  NotableFlags notable_flags;
  CategorizeAllMatchingFlags(
      matching_flags,
      canonical_token,
      module,
      package_dir,
      &notable_flags);
  DVLOG(2) << "Categorized matching flags:";
  DVLOG(2) << " perfect_match: " << notable_flags.perfect_match_flag.size();
  DVLOG(2) << " module: " << notable_flags.module_flags.size();
  DVLOG(2) << " package: " << notable_flags.package_flags.size();
  DVLOG(2) << " most common: " << notable_flags.most_common_flags.size();
  DVLOG(2) << " subpackage: " << notable_flags.subpackage_flags.size();

  vector<string> completions;
  FinalizeCompletionOutput(
      matching_flags,
      &options,
      &notable_flags,
      &completions);

  if (options.force_no_update)
    completions.push_back("~");

  DVLOG(1) << "Finalized with " << completions.size()
          << " chosen completions";

  for (vector<string>::const_iterator it = completions.begin();
      it != completions.end();
      ++it) {
    DVLOG(9) << "  Completion entry: '" << *it << "'";
    fprintf(stdout, "%s\n", it->c_str());
  }
}